

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Deserializer::ParseMetadataIndex
          (BP4Deserializer *this,BufferSTL *bufferSTL,size_t absoluteStartPos,bool hasHeader,
          bool oneStepOnly)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *this_01;
  undefined7 in_register_00000009;
  pointer pcVar9;
  undefined7 in_register_00000081;
  allocator local_ff;
  allocator local_fe;
  allocator local_fd;
  undefined4 local_fc;
  uint64_t currentTimeStamp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ptrs;
  uint64_t mpiRank;
  uint64_t currentStep;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_fc = (undefined4)CONCAT71(in_register_00000081,oneStepOnly);
  pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000009,hasHeader) == 0) {
    uVar8 = (bufferSTL->super_Buffer).m_Position;
  }
  else {
    (bufferSTL->super_Buffer).m_Position = 0;
    std::__cxx11::string::assign((char *)&this->m_Minifooter,(ulong)pcVar9);
    (bufferSTL->super_Buffer).m_Position = 0x24;
    cVar2 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[0x24];
    (bufferSTL->super_Buffer).m_Position = 0x25;
    (this->m_Minifooter).IsLittleEndian = cVar2 == '\0';
    bVar7 = helper::IsLittleEndian();
    if ((this->m_Minifooter).IsLittleEndian != bVar7) {
      std::__cxx11::string::string((string *)&ptrs,"Toolkit",(allocator *)&local_50);
      std::__cxx11::string::string
                ((string *)&currentStep,"format::bp::BP4Deserializer",(allocator *)&local_70);
      std::__cxx11::string::string((string *)&mpiRank,"ParseMetadataIndex",&local_fe);
      std::__cxx11::string::string
                ((string *)&currentTimeStamp,
                 "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
                 ,&local_ff);
      helper::Throw<std::runtime_error>
                ((string *)&ptrs,(string *)&currentStep,(string *)&mpiRank,
                 (string *)&currentTimeStamp,-1);
      std::__cxx11::string::~string((string *)&currentTimeStamp);
      std::__cxx11::string::~string((string *)&mpiRank);
      std::__cxx11::string::~string((string *)&currentStep);
      std::__cxx11::string::~string((string *)&ptrs);
    }
    (this->m_Minifooter).HasSubFiles = true;
    (bufferSTL->super_Buffer).m_Position = 0x20;
    pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    cVar2 = pcVar9[0x20];
    (this->m_Minifooter).ADIOSVersionMajor = cVar2 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x21;
    cVar3 = pcVar9[0x21];
    (this->m_Minifooter).ADIOSVersionMinor = cVar3 - 0x30U;
    (bufferSTL->super_Buffer).m_Position = 0x22;
    cVar4 = pcVar9[0x22];
    (this->m_Minifooter).ADIOSVersionPatch = cVar4 - 0x30U;
    (this->m_Minifooter).ADIOSVersion =
         (uint)(byte)(cVar4 - 0x30U) +
         (uint)(byte)(cVar3 - 0x30U) * 1000 + (uint)(byte)(cVar2 - 0x30U) * 1000000;
    (bufferSTL->super_Buffer).m_Position = 0x25;
    cVar2 = pcVar9[0x25];
    (bufferSTL->super_Buffer).m_Position = 0x26;
    (this->m_Minifooter).Version = cVar2;
    if (cVar2 != '\x04') {
      std::__cxx11::string::string((string *)&ptrs,"Toolkit",&local_fe);
      std::__cxx11::string::string((string *)&currentStep,"format::bp::BP4Deserializer",&local_ff);
      std::__cxx11::string::string((string *)&mpiRank,"ParseMetadataIndex",&local_fd);
      std::__cxx11::to_string(&local_70,(int)(this->m_Minifooter).Version);
      std::operator+(&local_50,"ADIOS2 BP4 Engine only supports bp format version 4, found ",
                     &local_70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentTimeStamp,&local_50," version");
      helper::Throw<std::runtime_error>
                ((string *)&ptrs,(string *)&currentStep,(string *)&mpiRank,
                 (string *)&currentTimeStamp,-1);
      std::__cxx11::string::~string((string *)&currentTimeStamp);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&mpiRank);
      std::__cxx11::string::~string((string *)&currentStep);
      std::__cxx11::string::~string((string *)&ptrs);
      pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (bufferSTL->super_Buffer).m_Position = 0x26;
    this->m_WriterIsActive = pcVar9[0x26] == '\x01';
    (bufferSTL->super_Buffer).m_Position = 0x40;
    uVar8 = 0x40;
  }
  do {
    ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    currentStep = *(uint64_t *)(pcVar9 + uVar8);
    (bufferSTL->super_Buffer).m_Position = uVar8 + 8;
    mpiRank = *(uint64_t *)(pcVar9 + uVar8 + 8);
    (bufferSTL->super_Buffer).m_Position = uVar8 + 0x10;
    lVar5 = *(long *)(pcVar9 + uVar8 + 0x10);
    (bufferSTL->super_Buffer).m_Position = uVar8 + 0x18;
    currentTimeStamp = lVar5 - absoluteStartPos;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
               &currentTimeStamp);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar5 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    currentTimeStamp = lVar5 - absoluteStartPos;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
               &currentTimeStamp);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar5 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    currentTimeStamp = lVar5 - absoluteStartPos;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
               &currentTimeStamp);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    lVar5 = *(long *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    currentTimeStamp = lVar5 - absoluteStartPos;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
               &currentTimeStamp);
    sVar6 = (bufferSTL->super_Buffer).m_Position;
    currentTimeStamp =
         *(uint64_t *)
          ((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + sVar6);
    (bufferSTL->super_Buffer).m_Position = sVar6 + 8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
               &currentTimeStamp);
    this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)(this->_vptr_BP4Deserializer[-3] +
                                 (long)&(this->m_Minifooter).VersionTag),&mpiRank);
    this_01 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_00,&currentStep);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    psVar1 = &(bufferSTL->super_Buffer).m_Position;
    *psVar1 = *psVar1 + 8;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&ptrs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    if ((char)local_fc != '\0') {
      return;
    }
    uVar8 = (bufferSTL->super_Buffer).m_Position;
    pcVar9 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  } while (uVar8 < (ulong)((long)(bufferSTL->m_Buffer).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pcVar9));
  return;
}

Assistant:

void BP4Deserializer::ParseMetadataIndex(BufferSTL &bufferSTL, const size_t absoluteStartPos,
                                         const bool hasHeader, const bool oneStepOnly)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (hasHeader)
    {
        // Read header (64 bytes)
        // long version string
        position = m_VersionTagPosition;
        m_Minifooter.VersionTag.assign(&buffer[position], m_VersionTagLength);

        position = m_EndianFlagPosition;
        const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
        m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
        if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
        {
            helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Deserializer",
                                              "ParseMetadataIndex",
                                              "reader found BigEndian bp file, "
                                              "this version of ADIOS2 wasn't compiled "
                                              "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                              "explicitly, in call to Open");
        }
#endif

        // This has no flag in BP4 header. Always true
        m_Minifooter.HasSubFiles = true;

        // Writer's ADIOS version
        position = m_VersionMajorPosition;
        uint8_t ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMajor = ascii - (uint8_t)'0';
        position = m_VersionMinorPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionMinor = ascii - (uint8_t)'0';
        position = m_VersionPatchPosition;
        ascii = helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_Minifooter.ADIOSVersionPatch = ascii - (uint8_t)'0';
        m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                    m_Minifooter.ADIOSVersionMinor * 1000 +
                                    m_Minifooter.ADIOSVersionPatch;

        // BP version
        position = m_BPVersionPosition;
        m_Minifooter.Version =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        if (m_Minifooter.Version != 4)
        {
            helper::Throw<std::runtime_error>(
                "Toolkit", "format::bp::BP4Deserializer", "ParseMetadataIndex",
                "ADIOS2 BP4 Engine only supports bp format "
                "version 4, found " +
                    std::to_string(m_Minifooter.Version) + " version");
        }

        // Writer active flag
        position = m_ActiveFlagPosition;
        const char activeChar =
            helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
        m_WriterIsActive = (activeChar == '\1' ? true : false);

        // move position to first row
        position = 64;
    }

    // Read each record now
    do
    {
        std::vector<uint64_t> ptrs;
        const uint64_t currentStep =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t mpiRank =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        const uint64_t pgIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(pgIndexStart - absoluteStartPos);
        const uint64_t variablesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(variablesIndexStart - absoluteStartPos);
        const uint64_t attributesIndexStart =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(attributesIndexStart - absoluteStartPos);
        const uint64_t currentStepEndPos =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentStepEndPos - absoluteStartPos);
        const uint64_t currentTimeStamp =
            helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
        ptrs.push_back(currentTimeStamp);
        m_MetadataIndexTable[mpiRank][currentStep] = ptrs;
        position += 8;
    } while (!oneStepOnly && position < buffer.size());
}